

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

module_ * __thiscall
pybind11::module_::
def<std::vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>(*)(std::__cxx11::string,unsigned_char),pybind11::return_value_policy>
          (module_ *this,char *name_,
          _func_vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_uchar
          **f,return_value_policy *extra)

{
  undefined8 *in_RDX;
  none *in_RSI;
  handle *in_RDI;
  bool in_stack_0000000f;
  char *in_stack_00000010;
  module_ *in_stack_00000018;
  handle in_stack_00000020;
  cpp_function func;
  handle *in_stack_ffffffffffffff68;
  sibling *this_00;
  return_value_policy *in_stack_ffffffffffffff88;
  handle in_stack_ffffffffffffff90;
  handle in_stack_ffffffffffffff98;
  name *in_stack_ffffffffffffffa0;
  name *f_00;
  PyObject *this_01;
  scope local_38;
  name local_30 [4];
  none *local_10;
  
  this_00 = (sibling *)*in_RDX;
  local_10 = in_RSI;
  pybind11::name::name(local_30,(char *)in_RSI);
  pybind11::scope::scope(&local_38,in_RDI);
  this_01 = in_RDI->m_ptr;
  none::none(local_10);
  f_00 = in_stack_ffffffffffffffa0;
  getattr(in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
  sibling::sibling(this_00,in_stack_ffffffffffffff68);
  cpp_function::
  cpp_function<std::vector<std::pair<bool,unsigned_long>,std::allocator<std::pair<bool,unsigned_long>>>,std::__cxx11::string,unsigned_char,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::return_value_policy>
            ((cpp_function *)this_01,
             (_func_vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_uchar
              *)f_00,in_stack_ffffffffffffffa0,(scope *)in_stack_ffffffffffffff98.m_ptr,
             (sibling *)in_stack_ffffffffffffff90.m_ptr,in_stack_ffffffffffffff88);
  object::~object((object *)0x28ac6b);
  none::~none((none *)0x28ac75);
  add_object(in_stack_00000018,in_stack_00000010,in_stack_00000020,in_stack_0000000f);
  cpp_function::~cpp_function((cpp_function *)0x28aca7);
  return (module_ *)in_RDI;
}

Assistant:

module_ &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }